

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::setPatterns(PatternModel *this,int pattern,CursorChangeFlags *flags)

{
  int _t1;
  undefined1 local_58 [4];
  int newsize;
  int local_2c;
  Song *pSStack_28;
  int oldsize;
  Song *song;
  CursorChangeFlags *flags_local;
  PatternModel *pPStack_10;
  int pattern_local;
  PatternModel *this_local;
  
  song = (Song *)flags;
  flags_local._4_4_ = pattern;
  pPStack_10 = this;
  pSStack_28 = source(this);
  if ((this->mShowPreviews & 1U) != 0) {
    setPreviewPatterns(this,flags_local._4_4_);
  }
  local_2c = trackerboy::Pattern::totalRows(&this->mPatternCurr);
  trackerboy::Song::getPattern((Pattern *)local_58,pSStack_28,flags_local._4_4_);
  memcpy(&this->mPatternCurr,local_58,0x24);
  _t1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
  if (local_2c != _t1) {
    patternSizeChanged(this,_t1);
  }
  invalidated(this);
  if (_t1 <= (this->mCursor).super_PatternCursorBase.row) {
    (this->mCursor).super_PatternCursorBase.row = _t1 + -1;
    QFlags<PatternModel::CursorChangeFlag>::operator|=
              ((QFlags<PatternModel::CursorChangeFlag> *)song,CursorRowChanged);
  }
  return;
}

Assistant:

void PatternModel::setPatterns(int pattern, CursorChangeFlags &flags) {

    auto song = source();

    if (mShowPreviews) {
        setPreviewPatterns(pattern);
    }

    // update the current pattern
    auto oldsize = mPatternCurr.totalRows();
    mPatternCurr = song->getPattern(pattern);
    auto newsize = mPatternCurr.totalRows();

    if (oldsize != newsize) {
        emit patternSizeChanged(newsize);
    }

    emit invalidated();

    if (mCursor.row >= newsize) {
        mCursor.row = newsize - 1;
        flags |= CursorRowChanged;
    }
}